

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O2

SRC_ERROR zoh_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  long lVar5;
  SRC_ERROR SVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  
  lVar8 = data->input_frames;
  if (lVar8 < 1) {
    return SRC_ERR_NO_ERROR;
  }
  pvVar3 = state->private_data;
  if (pvVar3 == (void *)0x0) {
    return SRC_ERR_NO_PRIVATE;
  }
  uVar2 = state->channels;
  lVar13 = (long)(int)uVar2;
  if (*(char *)((long)pvVar3 + 4) == '\0') {
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      *(float *)(*(long *)((long)pvVar3 + 0x28) + uVar7 * 4) = data->data_in[uVar7];
    }
    *(undefined1 *)((long)pvVar3 + 4) = 1;
  }
  lVar8 = lVar8 * lVar13;
  *(long *)((long)pvVar3 + 8) = lVar8;
  lVar10 = data->output_frames * lVar13;
  *(long *)((long)pvVar3 + 0x18) = lVar10;
  *(undefined8 *)((long)pvVar3 + 0x20) = 0;
  *(undefined8 *)((long)pvVar3 + 0x10) = 0;
  dVar1 = state->last_ratio;
  SVar6 = SRC_ERR_BAD_INTERNAL_STATE;
  if ((0.00390625 <= dVar1) && (dVar1 <= 256.0)) {
    dVar16 = state->last_position;
    lVar12 = 0;
    uVar7 = 0;
    dVar18 = dVar1;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    while (((dVar16 < 1.0 && (lVar12 < lVar10)) &&
           ((double)(int)uVar2 * dVar16 + 0.0 < (double)lVar8))) {
      if ((0 < lVar10) && (1e-20 < ABS(dVar1 - data->src_ratio))) {
        dVar18 = ((data->src_ratio - dVar1) * (double)lVar12) / (double)lVar10 + dVar1;
      }
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        data->data_out[lVar12] = *(float *)(*(long *)((long)pvVar3 + 0x28) + uVar9 * 4);
        lVar12 = lVar12 + 1;
        *(long *)((long)pvVar3 + 0x20) = lVar12;
      }
      dVar16 = dVar16 + 1.0 / dVar18;
    }
    dVar19 = dVar16 - (double)(int)ROUND(dVar16);
    dVar19 = (double)(~-(ulong)(dVar19 < 0.0) & (ulong)dVar19 |
                     (ulong)(dVar19 + 1.0) & -(ulong)(dVar19 < 0.0));
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar19;
    for (lVar11 = (long)(int)((int)ROUND(dVar16 - dVar19) * uVar2);
        (dVar16 = auVar17._0_8_, lVar12 < lVar10 &&
        ((double)(int)uVar2 * dVar16 + (double)lVar11 <= (double)lVar8));
        lVar11 = lVar11 + (int)((int)ROUND(dVar16 - auVar17._0_8_) * uVar2)) {
      if ((0 < lVar10) && (1e-20 < ABS(dVar1 - data->src_ratio))) {
        dVar18 = ((data->src_ratio - dVar1) * (double)lVar12) / (double)lVar10 + dVar1;
      }
      lVar15 = lVar11 - lVar13;
      lVar5 = lVar12;
      for (lVar14 = 0; -lVar14 != uVar7; lVar14 = lVar14 + -1) {
        data->data_out[lVar5] = data->data_in[lVar15];
        *(long *)((long)pvVar3 + 0x20) = lVar5 + 1;
        lVar15 = lVar15 + 1;
        lVar5 = lVar5 + 1;
      }
      dVar16 = dVar16 + 1.0 / dVar18;
      dVar19 = dVar16 - (double)(int)ROUND(dVar16);
      auVar20._0_8_ = ~-(ulong)(dVar19 < 0.0) & (ulong)dVar19;
      auVar20._8_8_ = 0;
      auVar4._8_4_ = auVar17._8_4_;
      auVar4._0_8_ = (ulong)(dVar19 + 1.0) & -(ulong)(dVar19 < 0.0);
      auVar4._12_4_ = auVar17._12_4_;
      auVar17 = auVar20 | auVar4;
      lVar12 = lVar12 - lVar14;
    }
    if (lVar11 - lVar8 != 0 && lVar8 <= lVar11) {
      dVar16 = dVar16 + (double)((lVar11 - lVar8) / lVar13);
      lVar11 = lVar8;
    }
    *(long *)((long)pvVar3 + 0x10) = lVar11;
    state->last_position = dVar16;
    if (0 < lVar11) {
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)(*(long *)((long)pvVar3 + 0x28) + uVar9 * 4) =
             data->data_in[(lVar11 + uVar9) - lVar13];
      }
    }
    state->last_ratio = dVar18;
    data->input_frames_used = lVar11 / lVar13;
    data->output_frames_gen = lVar12 / lVar13;
    SVar6 = SRC_ERR_NO_ERROR;
  }
  return SVar6;
}

Assistant:

static SRC_ERROR
zoh_vari_process (SRC_STATE *state, SRC_DATA *data)
{	ZOH_DATA 	*priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (ZOH_DATA*) state->private_data ;

	if (!priv->dirty)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->dirty = true ;
		} ;

	priv->in_count = data->input_frames * state->channels ;
	priv->out_count = data->output_frames * state->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = state->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + state->channels * input_index >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = priv->last_value [ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += state->channels * psf_lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + state->channels * input_index <= priv->in_count)
	{
		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = data->data_in [priv->in_used - state->channels + ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += state->channels * psf_lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / state->channels ;
		priv->in_used = priv->in_count ;
		} ;

	state->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - state->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / state->channels ;
	data->output_frames_gen = priv->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}